

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::BVHLoader(BVHLoader *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0080cdb0;
  (this->mFileName)._M_dataplus._M_p = (pointer)&(this->mFileName).field_2;
  (this->mFileName)._M_string_length = 0;
  (this->mFileName).field_2._M_local_buf[0] = '\0';
  (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->mLine = 0;
  (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mReader)._M_current = (char *)0x0;
  (this->mNodes).
  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mNodes).
  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mNodes).
  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mAnimTickDuration = 0.0;
  this->mAnimNumFrames = 0;
  this->noSkeletonMesh = false;
  return;
}

Assistant:

BVHLoader::BVHLoader()
    : mLine(),
    mAnimTickDuration(),
    mAnimNumFrames(),
    noSkeletonMesh()
{}